

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-decoder.cc
# Opt level: O1

int main(int argc,char **argv)

{
  Parameters **ppPVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  size_type sVar4;
  char cVar5;
  size_t sVar6;
  istream *piVar7;
  Tensor *t;
  pointer piVar8;
  ostream *poVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  pointer chars;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar16 [64];
  char **argv_local;
  pointer local_980;
  pointer local_978;
  uint doverall;
  uint dpredict;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  results;
  string fname;
  double dcorr;
  string line;
  vector<Instance,_std::allocator<Instance>_> dev;
  int total;
  uint uStack_8ec;
  Node *local_8e0 [5];
  double local_8b8;
  int argc_local;
  Model model;
  vector<Instance,_std::allocator<Instance>_> training;
  text_iarchive ia;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_7b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_7a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_788;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_770;
  undefined1 local_758 [16];
  ofstream out;
  Parameters *pPStack_740;
  Parameters *local_738;
  ios_base local_650 [272];
  RNNLanguageModel<cnn::FastLSTMBuilder> lm;
  ifstream in;
  
  argv_local = argv;
  argc_local = argc;
  cnn::Initialize(&argc_local,&argv_local,0x7c5,false);
  if (argc_local == 4) {
    training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading training data from ",0x1b);
    pcVar2 = argv_local[1];
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x292538);
    }
    else {
      sVar6 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"...\n",4);
    _total = (Node **)((ulong)uStack_8ec << 0x20);
    fname._M_dataplus._M_p._0_4_ = 0;
    std::ifstream::ifstream(&lm,argv_local[1],_S_in);
    if ((*(byte *)((long)&lm.p_wordpadding1 +
                  *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) != 0) {
      __assert_fail("in",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder.cc"
                    ,0x1df,"int main(int, char **)");
    }
    iVar11 = 0;
    iVar14 = 0;
    while( true ) {
      cVar5 = std::ios::widen((char)*(undefined8 *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy
                              + (char)&lm);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&lm,(string *)&line,cVar5);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      _out = (Parameters *)0x0;
      pPStack_740 = (Parameters *)0x0;
      local_738 = (Parameters *)0x0;
      ia._16_8_ = 0;
      ia.super_text_iarchive_impl<boost::archive::text_iarchive> =
           (text_iarchive_impl<boost::archive::text_iarchive>)0x0;
      ia._1_7_ = 0;
      ia._8_8_ = 0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&out,&wd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&model,&cd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&ia,&ld,(int *)&fname,&total);
      lVar10 = (long)pPStack_740 - (long)_out >> 2;
      if ((lVar10 != ((long)(ia._8_8_ - ia._0_8_) >> 3) * -0x5555555555555555) ||
         (lVar10 != ((long)model.all_params.
                           super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)model.all_params.
                           super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        __assert_fail("x.size() == y.size() && x.size() == c.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder.cc"
                      ,0x1e6,"int main(int, char **)");
      }
      if (pPStack_740 == _out) {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,line._M_dataplus._M_p,line._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar9);
        abort();
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_7a0,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_770,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&ia);
      Instance::Instance((Instance *)&in,(vector<int,_std::allocator<int>_> *)&out,&local_7a0,
                         &local_770);
      std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>
                (&training,(Instance *)&in);
      Instance::~Instance((Instance *)&in);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_770);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_7a0);
      uVar13 = (long)pPStack_740 - (long)_out;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&ia);
      if (_out != (Parameters *)0x0) {
        operator_delete(_out);
      }
      iVar11 = iVar11 + (int)(uVar13 >> 2);
      iVar14 = iVar14 + 1;
    }
    poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," lines, ",8);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," tokens, ",9);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," types\n",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"OOV ratio: ",0xb);
    poVar9 = std::ostream::_M_insert<double>
                       ((double)((float)(int)fname._M_dataplus._M_p / (float)total));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Tags: ",6);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::ifstream::~ifstream(&lm);
    wd.frozen = true;
    ppPVar1 = &lm.p_wordpadding_2;
    lm.p_w = (LookupParameters *)ppPVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"*UNK*","");
    cnn::Dict::SetUnk(&wd,(string *)&lm);
    if (lm.p_w != (LookupParameters *)ppPVar1) {
      operator_delete(lm.p_w);
    }
    lm.p_w = (LookupParameters *)ppPVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"NULL","");
    endlabel = cnn::Dict::Convert(&ld,(string *)&lm);
    if (lm.p_w != (LookupParameters *)ppPVar1) {
      operator_delete(lm.p_w);
    }
    cd.frozen = true;
    ld.frozen = true;
    lm.p_w = (LookupParameters *)ppPVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"*UNK*","");
    cnn::Dict::SetUnk(&cd,(string *)&lm);
    if (lm.p_w != (LookupParameters *)ppPVar1) {
      operator_delete(lm.p_w);
    }
    lm.p_w = (LookupParameters *)ppPVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"*UNK*","");
    cnn::Dict::SetUnk(&ld,(string *)&lm);
    if (lm.p_w != (LookupParameters *)ppPVar1) {
      operator_delete(lm.p_w);
    }
    VOCAB_SIZE = (uint)((ulong)((long)wd.words_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)wd.words_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
    CHAR_SIZE = (uint)((ulong)((long)cd.words_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)cd.words_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
    LABEL_SIZE = (uint)((ulong)((long)ld.words_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)ld.words_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading dev data from ",0x16);
    pcVar2 = argv_local[2];
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x292538);
    }
    else {
      sVar6 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"...\n",4);
    _total = (Node **)((ulong)_total & 0xffffffff00000000);
    fname._M_dataplus._M_p._0_4_ = 0;
    std::ifstream::ifstream(&lm,argv_local[2],_S_in);
    if ((*(byte *)((long)&lm.p_wordpadding1 +
                  *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) != 0) {
      __assert_fail("in",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder.cc"
                    ,0x202,"int main(int, char **)");
    }
    iVar14 = 0;
    iVar11 = 0;
    while( true ) {
      cVar5 = std::ios::widen((char)*(undefined8 *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy
                              + (char)&lm);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&lm,(string *)&line,cVar5);
      auVar15 = in_ZMM2._0_16_;
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      _out = (Parameters *)0x0;
      pPStack_740 = (Parameters *)0x0;
      local_738 = (Parameters *)0x0;
      ia._16_8_ = 0;
      ia.super_text_iarchive_impl<boost::archive::text_iarchive> =
           (text_iarchive_impl<boost::archive::text_iarchive>)0x0;
      ia._1_7_ = 0;
      ia._8_8_ = 0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&out,&wd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&model,&cd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&ia,&ld,(int *)&fname,&total);
      if ((long)pPStack_740 - (long)_out >> 2 !=
          ((long)(ia._8_8_ - ia._0_8_) >> 3) * -0x5555555555555555) {
        __assert_fail("x.size() == y.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder.cc"
                      ,0x209,"int main(int, char **)");
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_7b8,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_788,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&ia);
      Instance::Instance((Instance *)&in,(vector<int,_std::allocator<int>_> *)&out,&local_7b8,
                         &local_788);
      std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>(&dev,(Instance *)&in)
      ;
      Instance::~Instance((Instance *)&in);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_788);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_7b8);
      uVar13 = (long)pPStack_740 - (long)_out;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&ia);
      if (_out != (Parameters *)0x0) {
        operator_delete(_out);
      }
      iVar11 = iVar11 + (int)(uVar13 >> 2);
      iVar14 = iVar14 + 1;
    }
    poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," lines, ",8);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," tokens\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"OOV ratio: ",0xb);
    poVar9 = std::ostream::_M_insert<double>
                       ((double)((float)(int)fname._M_dataplus._M_p / (float)total));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::ifstream::~ifstream(&lm);
    model.lookup_params.
    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.gradient_norm_scratch = (float *)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.lookup_params.
    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.lookup_params.
    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auVar16 = ZEXT1664(auVar15);
    RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel(&lm,&model);
    std::__cxx11::string::string((string *)&fname,argv_local[3],(allocator *)&in);
    std::ifstream::ifstream(&in,(string *)&fname,_S_in);
    boost::archive::text_iarchive::text_iarchive(&ia,(istream *)&in,0);
    boost::serialization::
    singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Model>_>::
    get_instance();
    boost::archive::detail::basic_iarchive::load_object(&ia,(basic_iserializer *)&model);
    sVar4 = fname._M_string_length;
    eval = true;
    pcVar2 = argv_local[2];
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&fname,0,(char *)sVar4,(ulong)pcVar2);
    _total = local_8e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&total,CONCAT44(fname._M_dataplus._M_p._4_4_,(int)fname._M_dataplus._M_p),
               fname._M_string_length +
               CONCAT44(fname._M_dataplus._M_p._4_4_,(int)fname._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&total);
    std::ofstream::ofstream(&out,(string *)&total,_S_out);
    if (_total != local_8e0) {
      operator_delete(_total);
    }
    auVar15 = auVar16._0_16_;
    dpredict = 0;
    doverall = 0;
    dcorr = 0.0;
    local_978 = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      chars = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
              super__Vector_impl_data._M_start;
      do {
        cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&total);
        results.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        results.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        results.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                  ((RNNLanguageModel<cnn::FastLSTMBuilder> *)local_758,
                   (vector<int,_std::allocator<int>_> *)&lm,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)chars,&chars->chars,&chars->labels,(ComputationGraph *)&results,
                   (double *)&total,(uint *)&dcorr,&dpredict,SUB81(&doverall,0));
        local_980 = chars;
        t = cnn::ComputationGraph::forward((ComputationGraph *)&total);
        cnn::as_scalar(t);
        if (results.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            results.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar13 = 0;
          do {
            piVar8 = results.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            if (results.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish != piVar8) {
              uVar12 = 0;
              do {
                iVar11 = piVar8[uVar12];
                if ((int)((ulong)((long)ld.words_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)ld.words_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) <= iVar11) {
                  __assert_fail("id < (int)words_.size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/dict.h"
                                ,0x3b,"const std::string &cnn::Dict::Convert(const int &) const");
                }
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&out,
                                    ld.words_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar11]._M_dataplus.
                                    _M_p,ld.words_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[iVar11].
                                         _M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                uVar12 = uVar12 + 1;
                piVar8 = results.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              } while (uVar12 < (ulong)((long)results.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish - (long)piVar8 >> 2)
                      );
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"||| ",4);
            uVar13 = uVar13 + 1;
            uVar12 = ((long)results.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)results.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          } while (uVar13 <= uVar12 && uVar12 - uVar13 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
        std::ostream::flush();
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&results);
        cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&total);
        auVar15 = auVar16._0_16_;
        chars = local_980 + 1;
      } while (chars != local_978);
    }
    std::ofstream::close();
    eval = false;
    local_980 = (pointer)dcorr;
    auVar3 = vcvtusi2sd_avx512f(auVar15,dpredict);
    local_978 = auVar3._0_8_;
    auVar15 = vcvtusi2sd_avx512f(auVar15,doverall);
    local_8b8 = auVar15._0_8_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n***DEV P = ",0xc);
    local_978 = (pointer)((double)local_980 / (double)local_978);
    poVar9 = std::ostream::_M_insert<double>((double)local_978);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," R = ",5);
    local_980 = (pointer)((double)local_980 / local_8b8);
    poVar9 = std::ostream::_M_insert<double>((double)local_980);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," F=",3);
    poVar9 = std::ostream::_M_insert<double>
                       (((double)local_978 * ((double)local_980 + (double)local_980)) /
                        ((double)local_980 + (double)local_978));
    _total = (Node **)CONCAT71(stack0xfffffffffffff711,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&total,1);
    _out = _VTT;
    *(undefined8 *)
     (&out + (long)_VTT[-1].g.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&pPStack_740);
    std::ios_base::~ios_base(local_650);
    boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&ia);
    boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
              ((basic_text_iprimitive<std::istream> *)&ia.field_0x28);
    std::ifstream::~ifstream(&in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fname._M_dataplus._M_p._4_4_,(int)fname._M_dataplus._M_p) != &fname.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(fname._M_dataplus._M_p._4_4_,(int)fname._M_dataplus._M_p));
    }
    RNNLanguageModel<cnn::FastLSTMBuilder>::~RNNLanguageModel(&lm);
    cnn::Model::~Model(&model);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != &line.field_2) {
      operator_delete(line._M_dataplus._M_p);
    }
    std::vector<Instance,_std::allocator<Instance>_>::~vector(&dev);
    std::vector<Instance,_std::allocator<Instance>_>::~vector(&training);
    iVar11 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar2 = *argv_local;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x292538);
    }
    else {
      sVar6 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," corpus.txt dev.txt [model.params]\n",0x23);
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv, 1989);
  if (argc != 4) {
    cerr << "Usage: " << argv[0] << " corpus.txt dev.txt [model.params]\n";
    return 1;
  }
  vector<Instance> training,dev;
  string line;

  int tlc = 0;
  int ttoks = 0;
  
  cerr << "Reading training data from " << argv[1] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[1]);
    assert(in);
    while(getline(in, line)) {
      ++tlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, &c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size() && x.size() == c.size());
      if (x.size() == 0) { cerr << line << endl; abort(); }
      training.push_back(Instance(x,c,y));
      ttoks += x.size();
    }
    cerr << tlc << " lines, " << ttoks << " tokens, " << wd.size() << " types\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
    cerr << "Tags: " << ld.size() << endl;
  }
  wd.Freeze();
  wd.SetUnk("*UNK*");
  endlabel = ld.Convert("NULL");
  cd.Freeze();
  ld.Freeze(); // no new tag types allowed

  cd.SetUnk("*UNK*");
  ld.SetUnk("*UNK*");  
  VOCAB_SIZE = wd.size();
  CHAR_SIZE = cd.size();
  LABEL_SIZE = ld.size();

  int dlc = 0;
  int dtoks = 0;
  cerr << "Reading dev data from " << argv[2] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[2]);
    assert(in);
    while(getline(in, line)) {
      ++dlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, &c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size());
      dev.push_back(Instance(x,c,y));
      dtoks += x.size();
    }
    cerr << dlc << " lines, " << dtoks << " tokens\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
  }
  Model model;

  RNNLanguageModel<FastLSTMBuilder> lm(model);
  //RNNLanguageModel<SimpleRNNBuilder> lm(model);
    string fname = argv[3];
    ifstream in(fname);
    boost::archive::text_iarchive ia(in);
    ia >> model;
	eval = true;
	fname = argv[2];
  ofstream out(fname+"OUT");
      double dloss = 0;
      unsigned dpredict = 0;
      unsigned doverall = 0;
      double dcorr = 0;

      for (auto& sent : dev) {
        ComputationGraph cg;
        vector< vector<int> > results;
	lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, results, cg, &dcorr, &dpredict, &doverall, false);
        dloss += as_scalar(cg.forward());
        for(int i = 0; i < results.size(); i ++){
                for(int j = 0; j < results[i].size(); j ++){
                        out << ld.Convert(results[i][j]) <<" ";
                }
                out<<"||| ";
        }
        out<<"\n";
        out.flush();
      }
	out.close();
      //lm.p_th2t->scale_parameters(1/pdrop);
      eval = false;
      double P = (dcorr / dpredict);
      double R = (dcorr / doverall);
      double F = 2*P*R / (P+R);
      cerr << "\n***DEV P = " << P << " R = " << R << " F=" << F << ' ';
}